

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

ParseLocation * __thiscall
embree::StdStream::location(ParseLocation *__return_storage_ptr__,StdStream *this)

{
  ssize_t sVar1;
  ssize_t sVar2;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_28,
                 &(this->name).
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  sVar1 = this->lineNumber;
  sVar2 = this->colNumber;
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)__return_storage_ptr__,&local_28);
  __return_storage_ptr__->lineNumber = sVar1;
  __return_storage_ptr__->colNumber = sVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ParseLocation location() {
      return ParseLocation(name,lineNumber,colNumber,charNumber);
    }